

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime_format.cpp
# Opt level: O3

void __thiscall
duckdb::StrfTimeFormat::ConvertTimestampNSVector
          (StrfTimeFormat *this,Vector *input,Vector *result,idx_t count)

{
  anon_union_16_2_67f50693_for_value *paVar1;
  unsigned_long *puVar2;
  ulong uVar3;
  __uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_> _Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  byte bVar6;
  timestamp_ns_t tVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  SelectionVector *pSVar9;
  ulong uVar10;
  TemplatedValidityData<unsigned_long> *pTVar11;
  _Head_base<0UL,_unsigned_long_*,_false> _Var12;
  data_ptr_t pdVar13;
  idx_t iVar14;
  ulong uVar15;
  data_ptr_t pdVar16;
  ulong uVar17;
  idx_t idx_in_entry;
  ulong uVar18;
  ulong uVar19;
  string_t sVar20;
  anon_struct_16_3_d7536bce_for_pointer aVar21;
  UnifiedVectorFormat vdata;
  data_ptr_t local_c8;
  timestamp_ns_t local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_a0;
  data_ptr_t local_98;
  ulong local_90;
  Vector *local_88;
  idx_t local_80;
  UnifiedVectorFormat local_78;
  
  if (input->vector_type == FLAT_VECTOR) {
    Vector::SetVectorType(result,FLAT_VECTOR);
    local_c8 = result->data;
    local_98 = input->data;
    FlatVector::VerifyFlatVector(input);
    FlatVector::VerifyFlatVector(result);
    if ((input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != 0) {
        local_c8 = local_c8 + 8;
        iVar14 = 0;
        do {
          local_78.sel = *(SelectionVector **)(local_98 + iVar14 * 8);
          sVar20 = ConvertTimestampValue(this,(timestamp_ns_t *)&local_78,result);
          *(long *)(local_c8 + -8) = sVar20.value._0_8_;
          *(long *)local_c8 = sVar20.value._8_8_;
          iVar14 = iVar14 + 1;
          local_c8 = local_c8 + 0x10;
        } while (count != iVar14);
      }
    }
    else {
      (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity = count;
      local_a8.super_timestamp_t.value = (timestamp_t)(timestamp_t)count;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                ((duckdb *)&local_78,(unsigned_long **)&input->validity,(unsigned_long *)&local_a8);
      pdVar16 = local_78.data;
      pSVar9 = local_78.sel;
      local_78.sel = (SelectionVector *)0x0;
      local_78.data = (data_ptr_t)0x0;
      p_Var5 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)pSVar9;
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar16;
      if ((p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5),
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.data !=
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.data);
      }
      pTVar11 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                          (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                            validity_data);
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
           (unsigned_long *)
           (pTVar11->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
      if (0x3f < count + 0x3f) {
        local_90 = count + 0x3f >> 6;
        uVar15 = 0;
        uVar18 = 0;
        local_88 = result;
        do {
          pdVar16 = local_98;
          puVar2 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar2 == (unsigned_long *)0x0) {
            uVar19 = uVar15 + 0x40;
            if (count <= uVar15 + 0x40) {
              uVar19 = count;
            }
LAB_00a17756:
            uVar10 = uVar15;
            if (uVar15 < uVar19) {
              pdVar13 = local_c8 + uVar15 * 0x10 + 8;
              do {
                local_78.sel = *(SelectionVector **)(pdVar16 + uVar15 * 8);
                sVar20 = ConvertTimestampValue(this,(timestamp_ns_t *)&local_78,result);
                *(long *)(pdVar13 + -8) = sVar20.value._0_8_;
                *(long *)pdVar13 = sVar20.value._8_8_;
                uVar15 = uVar15 + 1;
                pdVar13 = pdVar13 + 0x10;
                uVar10 = uVar19;
              } while (uVar19 != uVar15);
            }
          }
          else {
            uVar3 = puVar2[uVar18];
            uVar19 = uVar15 + 0x40;
            if (count <= uVar15 + 0x40) {
              uVar19 = count;
            }
            uVar10 = uVar19;
            if (uVar3 != 0) {
              if (uVar3 == 0xffffffffffffffff) goto LAB_00a17756;
              uVar10 = uVar15;
              if (uVar15 < uVar19) {
                pdVar13 = local_c8 + uVar15 * 0x10 + 8;
                uVar17 = 0;
                do {
                  if ((uVar3 >> (uVar17 & 0x3f) & 1) != 0) {
                    local_78.sel = *(SelectionVector **)(pdVar16 + uVar17 * 8 + uVar15 * 8);
                    sVar20 = ConvertTimestampValue(this,(timestamp_ns_t *)&local_78,local_88);
                    *(long *)(pdVar13 + -8) = sVar20.value._0_8_;
                    *(long *)pdVar13 = sVar20.value._8_8_;
                  }
                  uVar17 = uVar17 + 1;
                  pdVar13 = pdVar13 + 0x10;
                  result = local_88;
                  uVar10 = uVar19;
                } while (uVar19 - uVar15 != uVar17);
              }
            }
          }
          uVar15 = uVar10;
          uVar18 = uVar18 + 1;
        } while (uVar18 != local_90);
      }
    }
  }
  else if (input->vector_type == CONSTANT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    paVar1 = (anon_union_16_2_67f50693_for_value *)result->data;
    pdVar16 = input->data;
    puVar2 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
      ConstantVector::SetNull(result,true);
      return;
    }
    ConstantVector::SetNull(result,false);
    local_78.sel = *(SelectionVector **)pdVar16;
    aVar21 = (anon_struct_16_3_d7536bce_for_pointer)
             ConvertTimestampValue(this,(timestamp_ns_t *)&local_78,result);
    paVar1->pointer = aVar21;
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat(input,count,&local_78);
    Vector::SetVectorType(result,FLAT_VECTOR);
    pdVar16 = result->data;
    FlatVector::VerifyFlatVector(result);
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != 0) {
        _Var4._M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
        super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (((unsafe_unique_array<unsigned_long> *)&(local_78.sel)->sel_vector)->
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t;
        pdVar16 = pdVar16 + 8;
        uVar18 = 0;
        do {
          uVar15 = uVar18;
          if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
              _Var4._M_t.
              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
              super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0) {
            uVar15 = (ulong)*(uint *)((long)_Var4._M_t.
                                            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                            .super__Head_base<0UL,_unsigned_long_*,_false>.
                                            _M_head_impl + uVar18 * 4);
          }
          local_a8.super_timestamp_t.value = (timestamp_t)((_func_int ***)local_78.data)[uVar15];
          sVar20 = ConvertTimestampValue(this,&local_a8,result);
          *(long *)(pdVar16 + -8) = sVar20.value._0_8_;
          *(long *)pdVar16 = sVar20.value._8_8_;
          uVar18 = uVar18 + 1;
          pdVar16 = pdVar16 + 0x10;
        } while (count != uVar18);
      }
    }
    else if (count != 0) {
      _Var4._M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
           (((unsafe_unique_array<unsigned_long> *)&(local_78.sel)->sel_vector)->
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t;
      pdVar16 = pdVar16 + 8;
      uVar18 = 0;
      do {
        uVar15 = uVar18;
        if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
            _Var4._M_t.
            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
            super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0) {
          uVar15 = (ulong)*(uint *)((long)_Var4._M_t.
                                          super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                          .super__Head_base<0UL,_unsigned_long_*,_false>.
                                          _M_head_impl + uVar18 * 4);
        }
        if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar15 >> 6]
             >> (uVar15 & 0x3f) & 1) == 0) {
          _Var12._M_head_impl =
               (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (_Var12._M_head_impl == (unsigned_long *)0x0) {
            local_80 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_a8,&local_80);
            p_Var8 = p_Stack_a0;
            tVar7.super_timestamp_t.value = local_a8.super_timestamp_t.value;
            local_a8.super_timestamp_t.value = (timestamp_t)0;
            p_Stack_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var5 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)tVar7.super_timestamp_t.value;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Var8;
            if ((p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5),
               p_Stack_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_a0);
            }
            pTVar11 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                  validity_data);
            _Var12._M_head_impl =
                 (pTVar11->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                 _Var12._M_head_impl;
          }
          bVar6 = (byte)uVar18 & 0x3f;
          _Var12._M_head_impl[uVar18 >> 6] =
               _Var12._M_head_impl[uVar18 >> 6] &
               (-2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6);
        }
        else {
          local_a8.super_timestamp_t.value = (timestamp_t)((_func_int ***)local_78.data)[uVar15];
          sVar20 = ConvertTimestampValue(this,&local_a8,result);
          *(long *)(pdVar16 + -8) = sVar20.value._0_8_;
          *(long *)pdVar16 = sVar20.value._8_8_;
        }
        uVar18 = uVar18 + 1;
        pdVar16 = pdVar16 + 0x10;
      } while (count != uVar18);
    }
    if (local_78.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

void StrfTimeFormat::ConvertTimestampNSVector(Vector &input, Vector &result, idx_t count) {
	D_ASSERT(input.GetType().id() == LogicalTypeId::TIMESTAMP_NS);
	D_ASSERT(result.GetType().id() == LogicalTypeId::VARCHAR);
	UnaryExecutor::ExecuteWithNulls<timestamp_ns_t, string_t>(
	    input, result, count,
	    [&](timestamp_ns_t input, ValidityMask &mask, idx_t idx) { return ConvertTimestampValue(input, result); });
}